

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O2

REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0,REF_DBL *orth1,REF_DBL *orth2)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  REF_DBL RVar5;
  REF_DBL RVar6;
  REF_DBL RVar7;
  REF_DBL RVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  undefined8 uStack_30;
  
  uVar3 = ref_math_normalize(orth0);
  if (uVar3 == 0) {
    auVar9 = *(undefined1 (*) [16])orth0;
    RVar5 = auVar9._0_8_;
    RVar6 = auVar9._8_8_;
    RVar7 = -RVar5;
    RVar8 = -RVar6;
    auVar1._8_8_ = RVar8;
    auVar1._0_8_ = RVar7;
    auVar9 = maxpd(auVar9,auVar1);
    if (auVar9._8_8_ <= auVar9._0_8_) {
      dVar14 = orth0[2];
      uVar11 = (undefined4)((ulong)dVar14 >> 0x20);
      if (dVar14 <= -dVar14) {
        uVar11 = (undefined4)((ulong)-dVar14 >> 0x20);
      }
      if ((double)CONCAT44(uVar11,SUB84(dVar14,0)) <= auVar9._0_8_) {
        *orth1 = 0.0;
        orth1[1] = 1.0;
        orth1[2] = 0.0;
        RVar5 = *orth0;
        RVar6 = orth0[1];
        RVar7 = -RVar5;
        RVar8 = -RVar6;
      }
    }
    uVar2 = (ulong)RVar6 & -(ulong)(0.0 < RVar6);
    auVar10._0_8_ = ~-(ulong)(0.0 < RVar5) & (ulong)RVar7;
    auVar10._8_8_ = ~-(ulong)(0.0 < RVar6) & (ulong)RVar8;
    auVar9._8_4_ = (int)uVar2;
    auVar9._0_8_ = (ulong)RVar5 & -(ulong)(0.0 < RVar5);
    auVar9._12_4_ = (int)(uVar2 >> 0x20);
    dVar14 = SUB168(auVar10 | auVar9,8);
    if (SUB168(auVar10 | auVar9,0) <= dVar14) {
      dVar13 = orth0[2];
      if (dVar13 <= -dVar13) {
        dVar13 = -dVar13;
      }
      if (dVar13 <= dVar14) {
        *orth1 = 0.0;
        orth1[1] = 0.0;
        orth1[2] = 1.0;
        RVar5 = *orth0;
        RVar6 = orth0[1];
        RVar7 = -RVar5;
      }
    }
    dVar14 = orth0[2];
    uVar11 = SUB84(dVar14,0);
    uVar12 = (undefined4)((ulong)dVar14 >> 0x20);
    if (dVar14 <= -dVar14) {
      dVar14 = -dVar14;
    }
    if ((double)(~-(ulong)(0.0 < RVar5) & (ulong)RVar7 | -(ulong)(0.0 < RVar5) & (ulong)RVar5) <=
        dVar14) {
      dVar13 = RVar6;
      if (RVar6 <= -RVar6) {
        dVar13 = -RVar6;
      }
      if (dVar13 <= dVar14) {
        *orth1 = 1.0;
        orth1[1] = 0.0;
        orth1[2] = 0.0;
        RVar5 = *orth0;
        RVar6 = orth0[1];
        uVar11 = SUB84(orth0[2],0);
        uVar12 = (undefined4)((ulong)orth0[2] >> 0x20);
      }
    }
    dVar14 = (double)CONCAT44(uVar12,uVar11) * orth1[2] + RVar5 * *orth1 + RVar6 * orth1[1];
    *orth1 = *orth1 - RVar5 * dVar14;
    orth1[1] = orth1[1] - orth0[1] * dVar14;
    orth1[2] = orth1[2] - dVar14 * orth0[2];
    uVar3 = ref_math_normalize(orth1);
    if (uVar3 == 0) {
      *orth2 = orth0[1] * orth1[2] - orth1[1] * orth0[2];
      orth2[1] = orth0[2] * *orth1 - orth1[2] * *orth0;
      orth2[2] = *orth0 * orth1[1] - *orth1 * orth0[1];
      return 0;
    }
    pcVar4 = "orthonormalize orth1";
    uStack_30 = 0x45;
  }
  else {
    pcVar4 = "orthonormalize input orth0";
    uStack_30 = 0x31;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",uStack_30,
         "ref_math_orthonormal_system",(ulong)uVar3,pcVar4);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0, REF_DBL *orth1,
                                               REF_DBL *orth2) {
  REF_DBL dot;
  RSS(ref_math_normalize(orth0), "orthonormalize input orth0");
  if (ABS(orth0[0]) >= ABS(orth0[1]) && ABS(orth0[0]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 1.0;
    orth1[2] = 0.0;
  }
  if (ABS(orth0[1]) >= ABS(orth0[0]) && ABS(orth0[1]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 0.0;
    orth1[2] = 1.0;
  }
  if (ABS(orth0[2]) >= ABS(orth0[0]) && ABS(orth0[2]) >= ABS(orth0[1])) {
    orth1[0] = 1.0;
    orth1[1] = 0.0;
    orth1[2] = 0.0;
  }
  dot = ref_math_dot(orth0, orth1);
  orth1[0] -= dot * orth0[0];
  orth1[1] -= dot * orth0[1];
  orth1[2] -= dot * orth0[2];
  RSS(ref_math_normalize(orth1), "orthonormalize orth1");
  ref_math_cross_product(orth0, orth1, orth2);
  return REF_SUCCESS;
}